

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunCommonSubexpressionElimination(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValueType VVar1;
  VmValue *pVVar2;
  VmConstant *pVVar3;
  VmConstant *pVVar4;
  bool bVar5;
  VmValue *pVVar6;
  ulong uVar7;
  VmConstant *rhs;
  VmConstant *this;
  VmValue *replacement;
  uint uVar8;
  bool bVar9;
  
  if ((value == (VmValue *)0x0) || (pVVar6 = value, value->typeID != 4)) {
    pVVar6 = (VmValue *)0x0;
  }
  if (pVVar6 == (VmValue *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((value != (VmValue *)0x0) &&
       (pVVar6 = (VmValue *)value[1].comment.end, pVVar6 != (VmValue *)0x0)) {
      do {
        pVVar2 = pVVar6[1].users.little[0];
        if (((pVVar6->hasSideEffects == false) && (pVVar6->hasMemoryAccess == false)) &&
           (replacement = *(VmValue **)&pVVar6[1].users.count, replacement != (VmValue *)0x0)) {
          uVar8 = 0;
          while ((*(int *)&replacement[1]._vptr_VmValue != *(int *)&pVVar6[1]._vptr_VmValue ||
                 (VVar1 = pVVar6[1].type.type, replacement[1].type.type != VVar1))) {
LAB_001a63fc:
            replacement = *(VmValue **)&replacement[1].users.count;
            if ((replacement == (VmValue *)0x0) || (bVar9 = 0x3e < uVar8, uVar8 = uVar8 + 1, bVar9))
            goto LAB_001a642e;
          }
          if ((ulong)VVar1 != 0) {
            bVar9 = true;
            uVar7 = 0;
            do {
              pVVar3 = *(VmConstant **)(*(long *)&pVVar6[1].typeID + uVar7 * 8);
              this = pVVar3;
              if ((pVVar3->super_VmValue).typeID != 1) {
                this = (VmConstant *)0x0;
              }
              pVVar4 = *(VmConstant **)(*(long *)&replacement[1].typeID + uVar7 * 8);
              rhs = pVVar4;
              if ((pVVar4->super_VmValue).typeID != 1) {
                rhs = (VmConstant *)0x0;
              }
              if ((this == (VmConstant *)0x0) || (rhs == (VmConstant *)0x0)) {
                bVar5 = pVVar3 == pVVar4;
              }
              else {
                bVar5 = VmConstant::operator==(this,rhs);
              }
              if (bVar5 == false) {
                bVar9 = false;
              }
              uVar7 = uVar7 + 1;
            } while (VVar1 != uVar7);
            if (!bVar9) goto LAB_001a63fc;
          }
          anon_unknown.dwarf_10d873::ReplaceValueUsersWith
                    (module,pVVar6,replacement,&module->commonSubexprEliminations);
        }
LAB_001a642e:
        pVVar6 = pVVar2;
      } while (pVVar2 != (VmValue *)0x0);
    }
  }
  else {
    pVVar6 = (VmValue *)pVVar6[1].source;
    while (pVVar6 != (VmValue *)0x0) {
      pVVar2 = (VmValue *)pVVar6[1].comment.begin;
      RunCommonSubexpressionElimination(ctx,module,pVVar6);
      pVVar6 = pVVar2;
    }
  }
  return;
}

Assistant:

void RunCommonSubexpressionElimination(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunCommonSubexpressionElimination(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->hasSideEffects || curr->hasMemoryAccess)
			{
				curr = next;
				continue;
			}

			VmInstruction *prev = curr->prevSibling;

			unsigned distance = 0;

			while(prev && distance < 64)
			{
				if(prev->cmd == curr->cmd && prev->arguments.count == curr->arguments.count)
				{
					bool same = true;

					for(unsigned i = 0, e = curr->arguments.count; i < e; i++)
					{
						VmValue *currArg = curr->arguments.data[i];
						VmValue *prevArg = prev->arguments.data[i];

						VmConstant *currArgAsConst = currArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(currArg) : NULL;
						VmConstant *prevArgAsConst = prevArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(prevArg) : NULL;

						if(currArgAsConst && prevArgAsConst)
						{
							if(!(*currArgAsConst == *prevArgAsConst))
								same = false;
						}
						else if(currArg != prevArg)
						{
							same = false;
						}
					}

					if(same)
					{
						ReplaceValueUsersWith(module, curr, prev, &module->commonSubexprEliminations);
						break;
					}
				}

				prev = prev->prevSibling;
				distance++;
			}

			curr = next;
		}
	}
}